

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int iVar1;
  ImVector<char> *pIVar2;
  ImVector<ImDrawChannel> *pIVar3;
  ImRect *pIVar4;
  ImGuiTextBuffer *pIVar5;
  int iVar6;
  int iVar7;
  ImGuiTable *pIVar8;
  ImGuiID IVar9;
  ImGuiTable *__dest;
  int iVar10;
  
  iVar6 = this->FreeIdx;
  iVar10 = (this->Buf).Size;
  if (iVar6 == iVar10) {
    iVar1 = iVar10 + 1;
    iVar7 = (this->Buf).Capacity;
    if (iVar7 <= iVar10) {
      if (iVar7 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar7 / 2 + iVar7;
      }
      if (iVar10 <= iVar1) {
        iVar10 = iVar1;
      }
      if (iVar7 < iVar10) {
        __dest = (ImGuiTable *)ImGui::MemAlloc((long)iVar10 * 0x1e0);
        pIVar8 = (this->Buf).Data;
        if (pIVar8 != (ImGuiTable *)0x0) {
          memcpy(__dest,pIVar8,(long)(this->Buf).Size * 0x1e0);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar10;
      }
    }
    (this->Buf).Size = iVar1;
    IVar9 = this->FreeIdx + 1;
  }
  else {
    if (iVar10 <= iVar6) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    IVar9 = (this->Buf).Data[iVar6].ID;
  }
  this->FreeIdx = IVar9;
  if ((this->Buf).Size <= iVar6) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  pIVar8 = (this->Buf).Data;
  pIVar3 = &pIVar8[iVar6].DrawSplitter._Channels;
  pIVar3->Size = 0;
  pIVar3->Capacity = 0;
  pIVar3->Data = (ImDrawChannel *)0x0;
  pIVar2 = &pIVar8[iVar6].RawData;
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (char *)0x0;
  pIVar8[iVar6].Columns.Data = (ImGuiTableColumn *)0x0;
  pIVar8[iVar6].Columns.DataEnd = (ImGuiTableColumn *)0x0;
  pIVar8[iVar6].DisplayOrderToIndex.Data = (char *)0x0;
  pIVar8[iVar6].DisplayOrderToIndex.DataEnd = (char *)0x0;
  pIVar8[iVar6].RowCellData.Data = (ImGuiTableCellData *)0x0;
  pIVar8[iVar6].RowCellData.DataEnd = (ImGuiTableCellData *)0x0;
  pIVar4 = &pIVar8[iVar6].OuterRect;
  (pIVar4->Min).x = 0.0;
  (pIVar4->Min).y = 0.0;
  (pIVar4->Max).x = 0.0;
  (pIVar4->Max).y = 0.0;
  pIVar4 = &pIVar8[iVar6].WorkRect;
  (pIVar4->Min).x = 0.0;
  (pIVar4->Min).y = 0.0;
  (pIVar4->Max).x = 0.0;
  (pIVar4->Max).y = 0.0;
  pIVar4 = &pIVar8[iVar6].InnerClipRect;
  (pIVar4->Min).x = 0.0;
  (pIVar4->Min).y = 0.0;
  (pIVar4->Max).x = 0.0;
  (pIVar4->Max).y = 0.0;
  pIVar4 = &pIVar8[iVar6].BackgroundClipRect;
  (pIVar4->Min).x = 0.0;
  (pIVar4->Min).y = 0.0;
  (pIVar4->Max).x = 0.0;
  (pIVar4->Max).y = 0.0;
  pIVar4 = &pIVar8[iVar6].HostClipRect;
  (pIVar4->Min).x = 0.0;
  (pIVar4->Min).y = 0.0;
  (pIVar4->Max).x = 0.0;
  (pIVar4->Max).y = 0.0;
  pIVar4 = &pIVar8[iVar6].HostWorkRect;
  (pIVar4->Min).x = 0.0;
  (pIVar4->Min).y = 0.0;
  (pIVar4->Max).x = 0.0;
  (pIVar4->Max).y = 0.0;
  pIVar4 = &pIVar8[iVar6].HostBackupClipRect;
  (pIVar4->Min).x = 0.0;
  (pIVar4->Min).y = 0.0;
  (pIVar4->Max).x = 0.0;
  (pIVar4->Max).y = 0.0;
  pIVar8[iVar6].HostCursorMaxPos.x = 0.0;
  pIVar8[iVar6].HostCursorMaxPos.y = 0.0;
  pIVar5 = &pIVar8[iVar6].ColumnsNames;
  (pIVar5->Buf).Size = 0;
  (pIVar5->Buf).Capacity = 0;
  (pIVar5->Buf).Data = (char *)0x0;
  pIVar8[iVar6].DrawSplitter._Current = 0;
  pIVar8[iVar6].DrawSplitter._Count = 1;
  memset(pIVar8 + iVar6,0,0x1e0);
  pIVar8[iVar6].SettingsOffset = -1;
  pIVar8[iVar6].LastFrameActive = -1;
  pIVar8[iVar6].InstanceInteracted = -1;
  pIVar8[iVar6].ContextPopupColumn = -1;
  pIVar8[iVar6].ReorderColumn = -1;
  pIVar8 = pIVar8 + iVar6;
  pIVar8->HoveredColumnBody = -1;
  pIVar8->HoveredColumnBorder = -1;
  pIVar8->ResizedColumn = -1;
  pIVar8->LastResizedColumn = -1;
  if ((this->Buf).Size <= iVar6) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  return (this->Buf).Data + iVar6;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }